

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

archive * archive_write_disk_new(void)

{
  __mode_t __mask;
  __uid_t _Var1;
  time_t tVar2;
  archive_string *paVar3;
  archive_write_disk *a;
  
  a = (archive_write_disk *)calloc(1,0x328);
  if (a == (archive_write_disk *)0x0) {
    a = (archive_write_disk *)0x0;
  }
  else {
    (a->archive).magic = 0xc001b0c5;
    (a->archive).state = 2;
    (a->archive).vtable = &archive_write_disk_vtable;
    tVar2 = time((time_t *)0x0);
    a->start_time = tVar2;
    __mask = umask(0);
    a->user_umask = __mask;
    umask(__mask);
    _Var1 = geteuid();
    a->user_uid = (ulong)_Var1;
    paVar3 = archive_string_ensure(&a->path_safe,0x200);
    if (paVar3 == (archive_string *)0x0) {
      free(a);
      a = (archive_write_disk *)0x0;
    }
    else {
      *(a->path_safe).s = '\0';
      a->decmpfs_compression_level = L'\x05';
    }
  }
  return &a->archive;
}

Assistant:

struct archive *
archive_write_disk_new(void)
{
	struct archive_write_disk *a;

	a = (struct archive_write_disk *)calloc(1, sizeof(*a));
	if (a == NULL)
		return (NULL);
	a->archive.magic = ARCHIVE_WRITE_DISK_MAGIC;
	/* We're ready to write a header immediately. */
	a->archive.state = ARCHIVE_STATE_HEADER;
	a->archive.vtable = &archive_write_disk_vtable;
	a->start_time = time(NULL);
	/* Query and restore the umask. */
	umask(a->user_umask = umask(0));
#ifdef HAVE_GETEUID
	a->user_uid = geteuid();
#endif /* HAVE_GETEUID */
	if (archive_string_ensure(&a->path_safe, 512) == NULL) {
		free(a);
		return (NULL);
	}
	a->path_safe.s[0] = 0;

#ifdef HAVE_ZLIB_H
	a->decmpfs_compression_level = 5;
#endif
	return (&a->archive);
}